

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viplanner.cpp
# Opt level: O3

CMDPSTATE * __thiscall VIPlanner::GetState(VIPlanner *this,int stateID)

{
  DiscreteSpaceInformation *pDVar1;
  pointer ppiVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  SBPL_Exception *this_00;
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  ppiVar2 = (pDVar1->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(pDVar1->StateID2IndexMapping).
                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppiVar2) >> 3) <= stateID) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,"ERROR in GetState: stateID is invalid");
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = (long)*ppiVar2[stateID];
  if (lVar4 != -1) {
    return (this->viPlanner).MDP.StateArray.
           super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4];
  }
  iVar3 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x16])();
  return (CMDPSTATE *)CONCAT44(extraout_var,iVar3);
}

Assistant:

CMDPSTATE* VIPlanner::GetState(int stateID)
{
    if (stateID >= (int)environment_->StateID2IndexMapping.size()) {
        throw SBPL_Exception("ERROR in GetState: stateID is invalid");
    }

    if (environment_->StateID2IndexMapping[stateID][VIMDP_STATEID2IND] == -1)
        return CreateState(stateID);
    else
        return viPlanner.MDP.StateArray[environment_->StateID2IndexMapping[stateID][VIMDP_STATEID2IND]];
}